

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtCell32>::cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtCell32> *this,cbtAlignedObjectArray<cbtCell32> *otherArray)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  cbtCell32 *pcVar20;
  size_t sVar21;
  long lVar22;
  long lVar23;
  
  this->m_ownsMemory = true;
  this->m_data = (cbtCell32 *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  iVar3 = otherArray->m_size;
  lVar23 = (long)iVar3;
  if ((-1 < lVar23) && (iVar3 != 0)) {
    pcVar20 = (cbtCell32 *)cbtAlignedAllocInternal(lVar23 << 7,0x10);
    iVar4 = this->m_size;
    if (0 < (long)iVar4) {
      lVar22 = 0;
      do {
        puVar1 = (undefined8 *)((long)this->m_data->m_cells + lVar22);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        uVar7 = puVar1[2];
        uVar8 = puVar1[3];
        uVar9 = puVar1[4];
        uVar10 = puVar1[5];
        uVar11 = puVar1[6];
        uVar12 = puVar1[7];
        puVar1 = (undefined8 *)((long)this->m_data->m_cells + lVar22 + 0x40);
        uVar13 = puVar1[1];
        uVar14 = puVar1[2];
        uVar15 = puVar1[3];
        uVar16 = puVar1[4];
        uVar17 = puVar1[5];
        uVar18 = puVar1[6];
        uVar19 = puVar1[7];
        puVar2 = (undefined8 *)((long)pcVar20->m_cells + lVar22 + 0x40);
        *puVar2 = *puVar1;
        puVar2[1] = uVar13;
        puVar2[2] = uVar14;
        puVar2[3] = uVar15;
        puVar2[4] = uVar16;
        puVar2[5] = uVar17;
        puVar2[6] = uVar18;
        puVar2[7] = uVar19;
        puVar1 = (undefined8 *)((long)pcVar20->m_cells + lVar22);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        puVar1[2] = uVar7;
        puVar1[3] = uVar8;
        puVar1[4] = uVar9;
        puVar1[5] = uVar10;
        puVar1[6] = uVar11;
        puVar1[7] = uVar12;
        lVar22 = lVar22 + 0x80;
      } while ((long)iVar4 * 0x80 != lVar22);
    }
    if (this->m_data != (cbtCell32 *)0x0) {
      if (this->m_ownsMemory == true) {
        cbtAlignedFreeInternal(this->m_data);
      }
      this->m_data = (cbtCell32 *)0x0;
    }
    this->m_ownsMemory = true;
    this->m_data = pcVar20;
    this->m_capacity = iVar3;
    if (iVar3 != 0) {
      sVar21 = 0;
      do {
        pcVar20 = this->m_data;
        puVar1 = (undefined8 *)((long)pcVar20->m_cells + sVar21 + 0x40);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1 = (undefined8 *)((long)pcVar20->m_cells + sVar21);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        sVar21 = sVar21 + 0x80;
      } while (lVar23 << 7 != sVar21);
    }
  }
  this->m_size = iVar3;
  if (0 < iVar3) {
    pcVar20 = this->m_data;
    lVar22 = 0;
    do {
      puVar1 = (undefined8 *)((long)otherArray->m_data->m_cells + lVar22);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      uVar7 = puVar1[2];
      uVar8 = puVar1[3];
      uVar9 = puVar1[4];
      uVar10 = puVar1[5];
      uVar11 = puVar1[6];
      uVar12 = puVar1[7];
      puVar1 = (undefined8 *)((long)otherArray->m_data->m_cells + lVar22 + 0x40);
      uVar13 = puVar1[1];
      uVar14 = puVar1[2];
      uVar15 = puVar1[3];
      uVar16 = puVar1[4];
      uVar17 = puVar1[5];
      uVar18 = puVar1[6];
      uVar19 = puVar1[7];
      puVar2 = (undefined8 *)((long)pcVar20->m_cells + lVar22 + 0x40);
      *puVar2 = *puVar1;
      puVar2[1] = uVar13;
      puVar2[2] = uVar14;
      puVar2[3] = uVar15;
      puVar2[4] = uVar16;
      puVar2[5] = uVar17;
      puVar2[6] = uVar18;
      puVar2[7] = uVar19;
      puVar1 = (undefined8 *)((long)pcVar20->m_cells + lVar22);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      puVar1[2] = uVar7;
      puVar1[3] = uVar8;
      puVar1[4] = uVar9;
      puVar1[5] = uVar10;
      puVar1[6] = uVar11;
      puVar1[7] = uVar12;
      lVar22 = lVar22 + 0x80;
    } while (lVar23 * 0x80 != lVar22);
  }
  return;
}

Assistant:

cbtAlignedObjectArray(const cbtAlignedObjectArray& otherArray)
	{
		init();

		int otherSize = otherArray.size();
		resize(otherSize);
		otherArray.copy(0, otherSize, m_data);
	}